

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O0

bool __thiscall
ritobin::io::impl_binary_write::BinBinaryWriter::write_value_visit
          (BinBinaryWriter *this,Embed *value)

{
  bool bVar1;
  Type TVar2;
  uint32_t value_00;
  size_t offset;
  size_type sVar3;
  reference this_00;
  ulong uVar4;
  size_t sVar5;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  FNV1a *name;
  const_iterator __end3;
  const_iterator __begin3;
  FieldList *__range3;
  size_t position;
  Embed *value_local;
  BinBinaryWriter *this_local;
  
  BinaryWriter::write(&this->writer,(int)value,in_RDX,in_RCX);
  offset = BinaryWriter::position(&this->writer);
  BinaryWriter::write<unsigned_int>(&this->writer,0);
  sVar3 = std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::size(&value->items);
  BinaryWriter::write<unsigned_short>(&this->writer,(unsigned_short)sVar3);
  __end3 = std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::begin(&value->items);
  name = (FNV1a *)std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::end(&value->items);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_ritobin::Field_*,_std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>_>
                      (&__end3,(__normal_iterator<const_ritobin::Field_*,_std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>_>
                                *)&name);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      sVar5 = BinaryWriter::position(&this->writer);
      BinaryWriter::write_at(&this->writer,offset,(sVar5 - offset) - 4);
      return true;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_ritobin::Field_*,_std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>_>
              ::operator*(&__end3);
    value_00 = FNV1a::hash(&this_00->key);
    BinaryWriter::write<unsigned_int>(&this->writer,value_00);
    TVar2 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
            ::value_to_type(&this_00->value);
    uVar4 = BinaryWriter::write(&this->writer,(uint)TVar2,__buf,in_RCX);
    if ((uVar4 & 1) == 0) break;
    bVar1 = write_value(this,&this_00->value);
    if (!bVar1) {
      bVar1 = fail_msg(this,"write_value(item)\n");
      return bVar1;
    }
    __gnu_cxx::
    __normal_iterator<const_ritobin::Field_*,_std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>_>
    ::operator++(&__end3);
  }
  bVar1 = fail_msg(this,"writer.write(ValueHelper::value_to_type(item))\n");
  return bVar1;
}

Assistant:

bool write_value_visit(Embed const& value) noexcept {
            writer.write(value.name);
            size_t position = writer.position();
            writer.write(uint32_t{ 0 });
            writer.write(static_cast<uint16_t>(value.items.size()));
            for (auto const& [name, item] : value.items) {
                writer.write(name.hash());
                bin_assert(writer.write(ValueHelper::value_to_type(item)));
                bin_assert(write_value(item));
            }
            writer.write_at(position, writer.position() - position - 4);
            return true;
        }